

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  ConfigFlagsTable *pCVar4;
  undefined8 *in_FS_OFFSET;
  char *memBlock;
  LargeHeapBlock *heapBlock;
  LargeHeapBlockFreeList *freeListEntry;
  ObjectInfoBits attributes_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  LargeHeapBucket *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x178,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  heapBlock = (LargeHeapBlock *)this->freeList;
  do {
    if (heapBlock == (LargeHeapBlock *)0x0) {
      return (char *)0x0;
    }
    pcVar3 = LargeHeapBlock::TryAllocFromFreeList
                       (*(LargeHeapBlock **)&(heapBlock->super_HeapBlock).heapBlockType,sizeCat,
                        attributes);
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
    if ((pCVar4->Verbose & 1U) != 0) {
      pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
      bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
      if (!bVar2) {
        pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
        bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,LargeMemoryAllocationPhase);
        if (!bVar2) goto LAB_00305195;
      }
      Output::Print(L"Unable to allocate object of size 0x%x from freelist\n",sizeCat);
    }
LAB_00305195:
    heapBlock = (LargeHeapBlock *)(heapBlock->super_HeapBlock).address;
  } while( true );
}

Assistant:

char *
LargeHeapBucket::TryAllocFromFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeList* freeListEntry = this->freeList;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        char * memBlock = heapBlock->TryAllocFromFreeList(sizeCat, attributes);
        if (memBlock)
        {
            // Don't need to verify zero fill here since we will do it in LargeHeapBucket::Alloc
            return memBlock;
        }
        else
        {
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Unable to allocate object of size 0x%x from freelist\n"), sizeCat);
#endif
        }

        freeListEntry = freeListEntry->next;
    }
    return nullptr;
}